

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.h
# Opt level: O0

void __thiscall lexical::~lexical(lexical *this)

{
  lexical *this_local;
  
  std::set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_>::~set(&this->symbols);
  std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::~vector(&this->errors);
  std::vector<Token,_std::allocator<Token>_>::~vector(&this->tokens);
  Table::~Table(&this->table);
  return;
}

Assistant:

lexical() = default;